

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalCopyToFile::WriteRotateInternal
          (PhysicalCopyToFile *this,ExecutionContext *context,GlobalSinkState *global_state,
          function<void_(duckdb::GlobalFunctionData_&)> *fun)

{
  __pthread_list_t *this_00;
  copy_rotate_next_file_t p_Var1;
  ClientContext *pCVar2;
  __pthread_internal_list *p_Var3;
  copy_to_finalize_t p_Var4;
  undefined1 auVar5 [8];
  undefined8 __p;
  pointer this_01;
  bool bVar6;
  type pGVar7;
  type pFVar8;
  type global_lock;
  type owned_lock;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> file_guard_1
  ;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> file_guard;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> global_guard
  ;
  undefined1 local_88 [8];
  undefined1 local_80 [16];
  StorageLock local_70;
  pointer local_60;
  pointer local_58;
  function<void_(duckdb::GlobalFunctionData_&)> *local_50;
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> *local_48;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> local_40;
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> local_38;
  
  local_38._M_head_impl = (GlobalOperatorState *)(global_state + 1);
  this_00 = &global_state[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
             __list;
  local_58 = (pointer)&global_state[2].super_StateWithBlockableTasks.blocked_tasks.
                       super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       .
                       super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = (pointer)&this->bind_data;
  local_40._M_head_impl = (GlobalSinkState *)&this->file_size_bytes;
  local_48 = &(this->super_PhysicalOperator).sink_state;
  local_70.internals.internal.
  super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)context;
  local_50 = fun;
  while( true ) {
    StorageLock::GetExclusiveLock(&local_70);
    pGVar7 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                          *)this_00);
    unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>,_true>::operator*
              ((unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>,_true> *)
               local_58);
    if (this->rotate != true) break;
    p_Var1 = (this->function).rotate_next_file;
    pFVar8 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)local_60);
    bVar6 = (*p_Var1)(pGVar7,pFVar8,(optional_idx *)local_40._M_head_impl);
    if (!bVar6) break;
    local_80._0_8_ = this_00->__prev;
    this_00->__prev = (__pthread_internal_list *)0x0;
    pCVar2 = (ClientContext *)
             (local_70.internals.internal.
              super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_vptr__Sp_counted_base;
    global_lock = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                  ::operator*(local_48);
    unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
              ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                *)&local_70);
    CreateFileState((PhysicalCopyToFile *)local_88,(ClientContext *)this,(GlobalSinkState *)pCVar2,
                    (StorageLockKey *)global_lock);
    auVar5 = local_88;
    local_88 = (undefined1  [8])0x0;
    p_Var3 = this_00->__prev;
    this_00->__prev = (__pthread_internal_list *)auVar5;
    if (p_Var3 != (__pthread_internal_list *)0x0) {
      (*(code *)p_Var3->__prev->__next)();
      if ((_Tuple_impl<0UL,_duckdb::StorageLock_*,_std::default_delete<duckdb::StorageLock>_>)
          local_88 != (StorageLock *)0x0) {
        (**(code **)(*(_func_int **)local_88 + 8))();
      }
    }
    this_01 = local_58;
    local_88 = local_58->id_;
    *(pointer *)local_58 = (pointer)0x0;
    make_uniq<duckdb::StorageLock>();
    __p = local_80._8_8_;
    local_80._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::__uniq_ptr_impl<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_>::reset
              ((__uniq_ptr_impl<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_> *)
               this_01,(pointer)__p);
    ::std::unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_>::~unique_ptr
              ((unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_> *)
               (local_80 + 8));
    ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
          &local_70,(pointer)0x0);
    unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>,_true>::operator->
              ((unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>,_true> *)
               local_88);
    StorageLock::GetExclusiveLock((StorageLock *)(local_80 + 8));
    p_Var4 = (this->function).copy_to_finalize;
    pCVar2 = (ClientContext *)
             (local_70.internals.internal.
              super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_vptr__Sp_counted_base;
    pFVar8 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)local_60);
    pGVar7 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
             ::operator*((unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                          *)local_80);
    (*p_Var4)(pCVar2,pFVar8,pGVar7);
    ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
                (local_80 + 8));
    ::std::unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_>::~unique_ptr
              ((unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_> *)
               local_88);
    if ((__pthread_internal_list *)local_80._0_8_ != (__pthread_internal_list *)0x0) {
      (*(code *)(*(__pthread_internal_list **)local_80._0_8_)->__next)();
    }
    ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
                &local_70);
  }
  StorageLock::GetSharedLock((StorageLock *)local_80);
  ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
        &local_70,(pointer)0x0);
  ::std::function<void_(duckdb::GlobalFunctionData_&)>::operator()(local_50,pGVar7);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              local_80);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              &local_70);
  return;
}

Assistant:

void PhysicalCopyToFile::WriteRotateInternal(ExecutionContext &context, GlobalSinkState &global_state,
                                             const std::function<void(GlobalFunctionData &)> &fun) const {
	auto &g = global_state.Cast<CopyToFunctionGlobalState>();

	// Loop until we can write (synchronize using locks when using parallel writes to the same files and "rotate")
	while (true) {
		// Grab global lock and dereference the current file state (and corresponding lock)
		auto global_guard = g.lock.GetExclusiveLock();
		auto &file_state = *g.global_state;
		auto &file_lock = *g.file_write_lock_if_rotating;
		if (rotate && function.rotate_next_file(file_state, *bind_data, file_size_bytes)) {
			// Global state must be rotated. Move to local scope, create an new one, and immediately release global lock
			auto owned_gstate = std::move(g.global_state);
			g.global_state = CreateFileState(context.client, *sink_state, *global_guard);
			auto owned_lock = std::move(g.file_write_lock_if_rotating);
			g.file_write_lock_if_rotating = make_uniq<StorageLock>();
			global_guard.reset();

			// This thread now waits for the exclusive lock on this file while other threads complete their writes
			// Note that new writes can still start, as there is already a new global state
			auto file_guard = owned_lock->GetExclusiveLock();
			function.copy_to_finalize(context.client, *bind_data, *owned_gstate);
		} else {
			// Get shared file write lock while holding global lock,
			// so file can't be rotated before we get the write lock
			auto file_guard = file_lock.GetSharedLock();

			// Because we got the shared lock on the file, we're sure that it will keep existing until we release it
			global_guard.reset();

			// Sink/Combine!
			fun(file_state);
			break;
		}
	}
}